

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<true> *handler)

{
  Ch *pCVar1;
  byte *pbVar2;
  undefined4 uVar3;
  ParseResult PVar4;
  
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  pbVar2 = (byte *)is->src_;
  while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
    pbVar2 = pbVar2 + 1;
  }
  is->src_ = (Ch *)pbVar2;
  if (*(int *)(this + 0x30) != 0) goto LAB_001e5549;
  if (*pbVar2 == 0) {
    uVar3 = 1;
  }
  else {
    ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
              (this,is,handler);
    if (*(int *)(this + 0x30) != 0) goto LAB_001e5549;
    pbVar2 = (byte *)is->src_;
    while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
      pbVar2 = pbVar2 + 1;
    }
    is->src_ = (Ch *)pbVar2;
    if ((*(int *)(this + 0x30) != 0) || (*pbVar2 == 0)) goto LAB_001e5549;
    uVar3 = 2;
  }
  pCVar1 = is->head_;
  *(undefined4 *)(this + 0x30) = uVar3;
  *(long *)(this + 0x38) = (long)pbVar2 - (long)pCVar1;
LAB_001e5549:
  PVar4._4_4_ = 0;
  PVar4.code_ = *(uint *)(this + 0x30);
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  PVar4.offset_ = *(size_t *)(this + 0x38);
  return PVar4;
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler)
  { if (parseFlags & kParseIterativeFlag)
      return IterativeParse<parseFlags>(is, handler);

    parseResult_.Clear();

    ClearStackOnExit scope(*this);

    SkipWhitespaceAndComments<parseFlags>(is);
    RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

    if (RAPIDJSON_UNLIKELY(is.Peek() == '\0'))
    { RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
    }
    else
    { ParseValue<parseFlags>(is, handler);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

      if (!(parseFlags & kParseStopWhenDoneFlag))
      { SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (RAPIDJSON_UNLIKELY(is.Peek() != '\0'))
        { RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
          RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
      }
    }

    return parseResult_;
  }